

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::checkRequirements(StoreTestInstance *this)

{
  VkPhysicalDeviceFeatures *__src;
  NotSupportedError *this_00;
  allocator<char> local_111;
  string local_110;
  undefined1 local_ec [8];
  VkPhysicalDeviceFeatures features;
  StoreTestInstance *this_local;
  
  features._212_8_ = this;
  __src = Context::getDeviceFeatures((this->super_BaseTestInstance).super_TestInstance.m_context);
  memcpy(local_ec,__src,0xdc);
  if ((((this->super_BaseTestInstance).m_declareImageFormatInShader & 1U) == 0) &&
     (features.shaderStorageImageMultisample == 0)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"shaderStorageImageWriteWithoutFormat feature not supported",
               &local_111);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_110);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

void StoreTestInstance::checkRequirements (void)
{
	const VkPhysicalDeviceFeatures	features	= m_context.getDeviceFeatures();

	if (!m_declareImageFormatInShader && !features.shaderStorageImageWriteWithoutFormat)
		throw tcu::NotSupportedError("shaderStorageImageWriteWithoutFormat feature not supported");
}